

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

FLOW_HANDLE
flow_create(uint32_t incoming_window_value,transfer_number next_outgoing_id_value,
           uint32_t outgoing_window_value)

{
  int iVar1;
  FLOW_INSTANCE_TAG FVar2;
  AMQP_VALUE item_value;
  AMQP_VALUE item_value_00;
  AMQP_VALUE item_value_01;
  int local_3c;
  int result;
  AMQP_VALUE outgoing_window_amqp_value;
  AMQP_VALUE next_outgoing_id_amqp_value;
  AMQP_VALUE incoming_window_amqp_value;
  FLOW_INSTANCE *flow_instance;
  uint32_t outgoing_window_value_local;
  transfer_number next_outgoing_id_value_local;
  uint32_t incoming_window_value_local;
  
  incoming_window_amqp_value = (AMQP_VALUE)malloc(8);
  if (incoming_window_amqp_value != (AMQP_VALUE)0x0) {
    FVar2.composite_value = amqpvalue_create_composite_with_ulong_descriptor(0x13);
    *(AMQP_VALUE *)incoming_window_amqp_value = FVar2.composite_value;
    if (*(AMQP_VALUE *)incoming_window_amqp_value == (AMQP_VALUE)0x0) {
      free(incoming_window_amqp_value);
      incoming_window_amqp_value = (AMQP_VALUE)0x0;
    }
    else {
      local_3c = 0;
      item_value = amqpvalue_create_uint(incoming_window_value);
      iVar1 = amqpvalue_set_composite_item(*(AMQP_VALUE *)incoming_window_amqp_value,1,item_value);
      if (iVar1 != 0) {
        local_3c = 0x1501;
      }
      item_value_00 = amqpvalue_create_transfer_number(next_outgoing_id_value);
      if ((local_3c == 0) &&
         (iVar1 = amqpvalue_set_composite_item
                            (*(AMQP_VALUE *)incoming_window_amqp_value,2,item_value_00), iVar1 != 0)
         ) {
        local_3c = 0x1506;
      }
      item_value_01 = amqpvalue_create_uint(outgoing_window_value);
      if ((local_3c == 0) &&
         (iVar1 = amqpvalue_set_composite_item
                            (*(AMQP_VALUE *)incoming_window_amqp_value,3,item_value_01), iVar1 != 0)
         ) {
        local_3c = 0x150b;
      }
      amqpvalue_destroy(item_value);
      amqpvalue_destroy(item_value_00);
      amqpvalue_destroy(item_value_01);
      if (local_3c != 0) {
        flow_destroy((FLOW_HANDLE)incoming_window_amqp_value);
        incoming_window_amqp_value = (AMQP_VALUE)0x0;
      }
    }
  }
  return (FLOW_HANDLE)incoming_window_amqp_value;
}

Assistant:

FLOW_HANDLE flow_create(uint32_t incoming_window_value, transfer_number next_outgoing_id_value, uint32_t outgoing_window_value)
{
    FLOW_INSTANCE* flow_instance = (FLOW_INSTANCE*)malloc(sizeof(FLOW_INSTANCE));
    if (flow_instance != NULL)
    {
        flow_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(19);
        if (flow_instance->composite_value == NULL)
        {
            free(flow_instance);
            flow_instance = NULL;
        }
        else
        {
            AMQP_VALUE incoming_window_amqp_value;
            AMQP_VALUE next_outgoing_id_amqp_value;
            AMQP_VALUE outgoing_window_amqp_value;
            int result = 0;

            incoming_window_amqp_value = amqpvalue_create_uint(incoming_window_value);
            if ((result == 0) && (amqpvalue_set_composite_item(flow_instance->composite_value, 1, incoming_window_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }
            next_outgoing_id_amqp_value = amqpvalue_create_transfer_number(next_outgoing_id_value);
            if ((result == 0) && (amqpvalue_set_composite_item(flow_instance->composite_value, 2, next_outgoing_id_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }
            outgoing_window_amqp_value = amqpvalue_create_uint(outgoing_window_value);
            if ((result == 0) && (amqpvalue_set_composite_item(flow_instance->composite_value, 3, outgoing_window_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(incoming_window_amqp_value);
            amqpvalue_destroy(next_outgoing_id_amqp_value);
            amqpvalue_destroy(outgoing_window_amqp_value);
            if (result != 0)
            {
                flow_destroy(flow_instance);
                flow_instance = NULL;
            }
        }
    }

    return flow_instance;
}